

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
server_task::get_list_id(vector<server_task,_std::allocator<server_task>_> *tasks)

{
  value_type *pvVar1;
  vector<server_task,_std::allocator<server_task>_> *in_RSI;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *in_RDI;
  size_t i;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *ids;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  hasher *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  value_type *__x;
  undefined8 local_30;
  
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::size(in_RSI);
  httplib::detail::std::allocator<int>::allocator((allocator<int> *)0x281e5e);
  httplib::detail::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::unordered_set(in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                  (key_equal *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                  (allocator_type *)0x281e7c);
  httplib::detail::std::allocator<int>::~allocator((allocator<int> *)0x281e88);
  local_30 = (value_type *)0x0;
  while (__x = local_30,
        pvVar1 = (value_type *)
                 httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::size
                           (in_RSI), __x < pvVar1) {
    httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::operator[]
              (in_RSI,(size_type)local_30);
    httplib::detail::std::
    unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert(in_RDI,__x)
    ;
    local_30 = (value_type *)((long)local_30 + 1);
  }
  return in_RDI;
}

Assistant:

static std::unordered_set<int> get_list_id(const std::vector<server_task> & tasks) {
        std::unordered_set<int> ids(tasks.size());
        for (size_t i = 0; i < tasks.size(); i++) {
            ids.insert(tasks[i].id);
        }
        return ids;
    }